

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O3

void poolDestroy(STRING_POOL *pool)

{
  block *pbVar1;
  BLOCK *pBVar2;
  
  pBVar2 = pool->blocks;
  while (pBVar2 != (BLOCK *)0x0) {
    pbVar1 = pBVar2->next;
    (*pool->mem->free_fcn)(pBVar2);
    pBVar2 = pbVar1;
  }
  pool->blocks = (BLOCK *)0x0;
  pBVar2 = pool->freeBlocks;
  while (pBVar2 != (BLOCK *)0x0) {
    pbVar1 = pBVar2->next;
    (*pool->mem->free_fcn)(pBVar2);
    pBVar2 = pbVar1;
  }
  pool->ptr = (XML_Char *)0x0;
  pool->start = (XML_Char *)0x0;
  pool->freeBlocks = (BLOCK *)0x0;
  pool->end = (XML_Char *)0x0;
  return;
}

Assistant:

static
void poolDestroy(STRING_POOL *pool)
{
  BLOCK *p = pool->blocks;
  while (p) {
    BLOCK *tem = p->next;
    pool->mem->free_fcn(p);
    p = tem;
  }
  pool->blocks = 0;
  p = pool->freeBlocks;
  while (p) {
    BLOCK *tem = p->next;
    pool->mem->free_fcn(p);
    p = tem;
  }
  pool->freeBlocks = 0;
  pool->ptr = 0;
  pool->start = 0;
  pool->end = 0;
}